

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test::
TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test
          (TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test *this)

{
  TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_TerminalInEachSet_Open_Test_00252458;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TerminalInEachSet_Open)
{
	addPair(Tile::NineOfCharacters);
	addSequence(Tile::OneOfCharacters, true);
	addTriplet(Tile::NineOfCircles, false);
	addSequence(Tile::OneOfBamboos, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TerminalInEachSet));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(2, r.doubling_factor);
}